

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

bool __thiscall
glslang::TSymbolTableLevel::amend(TSymbolTableLevel *this,TSymbol *symbol,int firstNewMember)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*symbol->_vptr_TSymbol[3])(symbol);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var,iVar2),0,5,"anon@");
  if (iVar2 != 0) {
    return false;
  }
  bVar1 = insertAnonymousMembers(this,symbol,firstNewMember);
  return bVar1;
}

Assistant:

bool amend(TSymbol& symbol, int firstNewMember)
    {
        // See insert() for comments on basic explanation of insert.
        // This operates similarly, but more simply.
        // Only supporting amend of anonymous blocks so far.
        if (IsAnonymous(symbol.getName()))
            return insertAnonymousMembers(symbol, firstNewMember);
        else
            return false;
    }